

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::read_response(cgi_forwarder *this)

{
  element_type *peVar1;
  char *p;
  mutable_buffer tmp;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_80;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_78;
  intrusive_ptr<booster::callable<void_()>_> local_70;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_68 [8]
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  callable<void_()> *local_58 [3];
  pointer local_40;
  pointer peStack_38;
  pointer local_30;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_28 [8]
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  peVar1 = (this->conn_).
           super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_28,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&local_70,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)cleanup);
  local_58[0] = local_70.p_;
  if (local_70.p_ != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  (*peVar1->_vptr_connection[0x13])(peVar1,local_58);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)local_58);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_70);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  p = (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start;
  local_58[0] = (callable<void_()> *)((ulong)local_58[0] & 0xffffffff00000000);
  local_40 = (pointer)0x0;
  peStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add
            ((buffer_impl<char_*> *)local_58,p,
             (long)(this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)p);
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_68,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&local_80,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_response_read);
  local_78.p_ = local_80.p_;
  if (local_80.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
    booster::atomic_counter::inc();
  }
  booster::aio::stream_socket::async_read_some((mutable_buffer *)&this->scgi_,(callback *)local_58);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_78);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_80);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_40 != (pointer)0x0) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void read_response() 
		{
			conn_->async_read_eof(mfunc_to_handler(&cgi_forwarder::cleanup,shared_from_this()));
			scgi_.async_read_some(booster::aio::buffer(response_),
						mfunc_to_io_handler(&cgi_forwarder::on_response_read,shared_from_this()));
		}